

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser_.cxx
# Opt level: O0

void __thiscall Fl_Browser_::display(Fl_Browser_ *this,void *item)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  void *local_48;
  void *lp;
  void *pvStack_38;
  int h1;
  void *l;
  int local_28;
  int Yp;
  int H;
  int W;
  int Y;
  int X;
  void *item_local;
  Fl_Browser_ *this_local;
  
  _Y = item;
  item_local = this;
  update_top(this);
  pvVar1 = _Y;
  iVar2 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[10])();
  if (pvVar1 == (void *)CONCAT44(extraout_var,iVar2)) {
    position(this,0);
  }
  else {
    bbox(this,&W,&H,&Yp,&local_28);
    pvStack_38 = this->top_;
    l._4_4_ = -this->offset_;
    H = l._4_4_;
    if (pvStack_38 == _Y) {
      position(this,this->real_position_ + l._4_4_);
    }
    else {
      iVar2 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xc])(this,pvStack_38);
      local_48 = (void *)CONCAT44(extraout_var_00,iVar2);
      if (local_48 == _Y) {
        iVar2 = this->real_position_ + H;
        iVar3 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x10])(this,local_48);
        position(this,iVar2 - iVar3);
      }
      else {
        while (pvStack_38 != (void *)0x0 || local_48 != (void *)0x0) {
          if (pvStack_38 != (void *)0x0) {
            iVar2 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x10])(this,pvStack_38)
            ;
            if (pvStack_38 == _Y) {
              if (local_28 < H) {
                position(this,(this->real_position_ + H) - (local_28 - iVar2) / 2);
                return;
              }
              H = (H + iVar2) - local_28;
              if (H < 1) {
                return;
              }
              position(this,this->real_position_ + H);
              return;
            }
            H = iVar2 + H;
            iVar2 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,pvStack_38);
            pvStack_38 = (void *)CONCAT44(extraout_var_01,iVar2);
          }
          if (local_48 != (void *)0x0) {
            iVar2 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x10])(this,local_48);
            l._4_4_ = l._4_4_ - iVar2;
            if (local_48 == _Y) {
              if (-1 < l._4_4_ + iVar2) {
                position(this,this->real_position_ + l._4_4_);
                return;
              }
              position(this,(this->real_position_ + l._4_4_) - (local_28 - iVar2) / 2);
              return;
            }
            iVar2 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xc])(this,local_48);
            local_48 = (void *)CONCAT44(extraout_var_02,iVar2);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Fl_Browser_::display(void* item) {

  // First special case - want to display first item in the list?
  update_top();
  if (item == item_first()) {position(0); return;}

  int X, Y, W, H, Yp; bbox(X, Y, W, H);
  void* l = top_;
  Y = Yp = -offset_;
  int h1;

  // 2nd special case - want to display item already displayed at top of browser?
  if (l == item) {position(real_position_+Y); return;} // scroll up a bit

  // 3rd special case - want to display item just above top of browser?
  void* lp = item_prev(l);
  if (lp == item) {position(real_position_+Y-item_quick_height(lp)); return;}

#ifdef DISPLAY_SEARCH_BOTH_WAYS_AT_ONCE
  // search for item.  We search both up and down the list at the same time,
  // this evens up the execution time for the two cases - the old way was
  // much slower for going up than for going down.
  while (l || lp) {
    if (l) {
      h1 = item_quick_height(l);
      if (l == item) {
	if (Y <= H) { // it is visible or right at bottom
	  Y = Y+h1-H; // find where bottom edge is
	  if (Y > 0) position(real_position_+Y); // scroll down a bit
	} else {
	  position(real_position_+Y-(H-h1)/2); // center it
	}
	return;
      }
      Y += h1;
      l = item_next(l);
    }
    if (lp) {
      h1 = item_quick_height(lp);
      Yp -= h1;
      if (lp == item) {
	if ((Yp + h1) >= 0) position(real_position_+Yp);
	else position(real_position_+Yp-(H-h1)/2);
	return;
      }
      lp = item_prev(lp);
    }
  }
#else
  // Old version went forwards and then backwards:
  // search forward for it:
  l = top_;
  for (; l; l = item_next(l)) {
    h1 = item_quick_height(l);
    if (l == item) {
      if (Y <= H) { // it is visible or right at bottom
	Y = Y+h1-H; // find where bottom edge is
	if (Y > 0) position(real_position_+Y); // scroll down a bit
      } else {
	position(real_position_+Y-(H-h1)/2); // center it
      }
      return;
    }
    Y += h1;
  }
  // search backward for it, if found center it:
  l = lp;
  Y = -offset_;
  for (; l; l = item_prev(l)) {
    h1 = item_quick_height(l);
    Y -= h1;
    if (l == item) {
      if ((Y + h1) >= 0) position(real_position_+Y);
      else position(real_position_+Y-(H-h1)/2);
      return;
    }
  }
#endif
}